

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# joiner_session.cpp
# Opt level: O1

int __thiscall
ot::commissioner::JoinerSession::RelaySocket::Send(RelaySocket *this,uint8_t *aBuf,size_t aLen)

{
  MessageSubType MVar1;
  JoinerSession *this_00;
  type atVar2 [2];
  undefined4 uVar3;
  char *pcVar4;
  int iVar5;
  char *from;
  char *to;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  bool bVar6;
  string_view fmt;
  format_args args;
  Error error;
  writer write;
  string local_f8;
  size_t local_d8;
  undefined1 local_d0 [8];
  _Alloc_hider local_c8;
  size_type local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  undefined1 local_a8 [8];
  size_type *local_a0;
  format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char_*>
  *local_98;
  size_type sStack_90;
  format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char_*>
  *local_88;
  code *local_80;
  code *local_78;
  string local_70;
  string local_50;
  
  local_c8._M_p = (pointer)&local_b8;
  local_d0._0_4_ = kNone;
  local_c0 = 0;
  local_b8._M_local_buf[0] = '\0';
  MVar1 = (this->super_Socket).mSubType;
  this_00 = this->mJoinerSession;
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_f8,aBuf,aBuf + aLen,
             (allocator_type *)&local_50);
  SendRlyTx((Error *)local_a8,this_00,(ByteArray *)&local_f8,MVar1 == kJoinFinResponse);
  local_d0._0_4_ = local_a8._0_4_;
  std::__cxx11::string::operator=((string *)&local_c8,(string *)&local_a0);
  if (local_a0 != &sStack_90) {
    operator_delete(local_a0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete(local_f8._M_dataplus._M_p);
  }
  if (local_d0._0_4_ != none_type) {
    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    local_d8 = aLen;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"joiner-session","");
    local_a8._0_4_ = pointer_type;
    local_a8._4_4_ = string_type;
    from = "session(={}) send RLY_TX.ntf failed: {}";
    local_a0 = (size_type *)0x2519c5;
    local_98 = (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char_*>
                *)0x27;
    sStack_90 = 0x200000000;
    local_80 = ::fmt::v10::detail::
               parse_format_specs<void*,fmt::v10::detail::compile_parse_context<char>>;
    local_78 = ::fmt::v10::detail::
               parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
    ;
    local_88 = (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char_*>
                *)local_a8;
    local_70._M_dataplus._M_p = (pointer)local_a8;
    do {
      if (from == "") break;
      to = from;
      if (*from == '{') {
LAB_001e9e24:
        ::fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::writer::operator()((writer *)&local_70,from,to);
        from = ::fmt::v10::detail::
               parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,void*,std::__cxx11::string>&>
                         (to,"",(format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char_*>
                                 *)local_a8);
        bVar6 = true;
      }
      else {
        to = from + 1;
        bVar6 = to != "";
        if (bVar6) {
          if (*to != '{') {
            pcVar4 = from + 2;
            do {
              to = pcVar4;
              bVar6 = to != "";
              if (to == "") goto LAB_001e9e20;
              pcVar4 = to + 1;
            } while (*to != '{');
          }
          bVar6 = true;
        }
LAB_001e9e20:
        if (bVar6) goto LAB_001e9e24;
        ::fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::writer::operator()((writer *)&local_70,from,"");
        bVar6 = false;
      }
    } while (bVar6);
    atVar2 = (type  [2])this->mJoinerSession;
    Error::ToString_abi_cxx11_(&local_70,(Error *)local_d0);
    local_98 = (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char_*>
                *)local_70._M_dataplus._M_p;
    sStack_90 = local_70._M_string_length;
    fmt.size_ = 0xde;
    fmt.data_ = (char *)0x27;
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)local_a8;
    local_a8 = (undefined1  [8])atVar2;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_50,(v10 *)"session(={}) send RLY_TX.ntf failed: {}",fmt,args);
    aLen = local_d8;
    Log(kError,&local_f8,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p);
    }
  }
  uVar3 = local_d0._0_4_;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_p != &local_b8) {
    operator_delete(local_c8._M_p);
  }
  iVar5 = -0x4e;
  if (uVar3 == none_type) {
    iVar5 = (int)aLen;
  }
  return iVar5;
}

Assistant:

int JoinerSession::RelaySocket::Send(const uint8_t *aBuf, size_t aLen)
{
    Error error;
    bool  includeKek = GetSubType() == MessageSubType::kJoinFinResponse;

    SuccessOrExit(error = mJoinerSession.SendRlyTx({aBuf, aBuf + aLen}, includeKek));

exit:
    if (error != ErrorCode::kNone)
    {
        LOG_ERROR(LOG_REGION_JOINER_SESSION, "session(={}) send RLY_TX.ntf failed: {}",
                  static_cast<void *>(&mJoinerSession), error.ToString());
    }
    return error == ErrorCode::kNone ? static_cast<int>(aLen) : MBEDTLS_ERR_NET_SEND_FAILED;
}